

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__pic_info(stbi__context *s,int *x,int *y,int *comp)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  byte bVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  stbi_uc *psVar8;
  byte *pbVar9;
  uint unaff_R13D;
  bool bVar10;
  
  iVar6 = stbi__pic_is4(s,anon_var_dwarf_1f03f);
  if (iVar6 == 0) goto LAB_0011d19f;
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0011d122:
    s->img_buffer = s->img_buffer + 0x58;
  }
  else {
    iVar6 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
    if (0x57 < iVar6) goto LAB_0011d122;
    s->img_buffer = s->img_buffer_end;
    (*(s->io).skip)(s->io_user_data,0x58 - iVar6);
  }
  iVar6 = stbi__get16be(s);
  if (x != (int *)0x0) {
    *x = iVar6;
  }
  iVar7 = stbi__get16be(s);
  if (y != (int *)0x0) {
    *y = iVar7;
    iVar7 = iVar6;
  }
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0011d16b:
    if (s->img_buffer_end <= s->img_buffer) goto LAB_0011d19f;
  }
  else {
    iVar6 = (*(s->io).eof)(s->io_user_data);
    if (iVar6 != 0) {
      if (s->read_from_callbacks == 0) goto LAB_0011d19f;
      goto LAB_0011d16b;
    }
  }
  iVar6 = iVar7;
  if (x != (int *)0x0) {
    iVar6 = *x;
  }
  if (iVar6 != 0) {
    if (y != (int *)0x0) {
      iVar7 = *y;
    }
    if ((int)(0x10000000 / (long)iVar6) < iVar7) {
LAB_0011d19f:
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      return 0;
    }
  }
  if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
    iVar6 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
    if (iVar6 < 8) {
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,8 - iVar6);
      goto LAB_0011d205;
    }
  }
  s->img_buffer = s->img_buffer + 8;
LAB_0011d205:
  psVar1 = s->buffer_start;
  psVar2 = s->buffer_start + 1;
  bVar3 = 0;
  iVar6 = 0;
  do {
    if (iVar6 == 10) {
LAB_0011d457:
      bVar4 = false;
    }
    else {
      pbVar9 = s->img_buffer;
      if (pbVar9 < s->img_buffer_end) {
LAB_0011d292:
        s->img_buffer = pbVar9 + 1;
        unaff_R13D = (uint)*pbVar9;
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
          if (iVar7 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar2;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar1 + iVar7;
          }
          pbVar9 = s->img_buffer;
          goto LAB_0011d292;
        }
        unaff_R13D = 0;
      }
      psVar8 = s->img_buffer;
      if (psVar8 < s->img_buffer_end) {
LAB_0011d30c:
        s->img_buffer = psVar8 + 1;
        bVar10 = *psVar8 == '\b';
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
          if (iVar7 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar2;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar1 + iVar7;
          }
          psVar8 = s->img_buffer;
          goto LAB_0011d30c;
        }
        bVar10 = false;
      }
      psVar8 = s->img_buffer;
      if (psVar8 < s->img_buffer_end) {
LAB_0011d384:
        s->img_buffer = psVar8 + 1;
      }
      else if (s->read_from_callbacks != 0) {
        iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
        if (iVar7 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar1;
          s->img_buffer_end = psVar2;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar1;
          s->img_buffer_end = psVar1 + iVar7;
        }
        psVar8 = s->img_buffer;
        goto LAB_0011d384;
      }
      pbVar9 = s->img_buffer;
      if (pbVar9 < s->img_buffer_end) {
LAB_0011d3f8:
        s->img_buffer = pbVar9 + 1;
        bVar5 = *pbVar9;
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
          if (iVar7 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar2;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar1 + iVar7;
          }
          pbVar9 = s->img_buffer;
          goto LAB_0011d3f8;
        }
        bVar5 = 0;
      }
      iVar6 = iVar6 + 1;
      bVar3 = bVar3 | bVar5;
      if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
        iVar7 = (*(s->io).eof)(s->io_user_data);
        if (iVar7 == 0) {
          bVar4 = true;
          if (bVar10) goto LAB_0011d459;
        }
        else if (s->read_from_callbacks != 0) goto LAB_0011d426;
LAB_0011d447:
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
        goto LAB_0011d457;
      }
LAB_0011d426:
      if ((s->img_buffer_end <= s->img_buffer) || (bVar4 = true, !bVar10)) goto LAB_0011d447;
    }
LAB_0011d459:
    if (!bVar4) {
      return 0;
    }
    if (unaff_R13D == 0) {
      if (comp != (int *)0x0) {
        *comp = 4 - (uint)((bVar3 & 0x10) == 0);
      }
      return 1;
    }
  } while( true );
}

Assistant:

static int stbi__pic_info(stbi__context *s, int *x, int *y, int *comp) {
  int act_comp = 0, num_packets = 0, chained, dummy;
  stbi__pic_packet packets[10];

  if (!x)
    x = &dummy;
  if (!y)
    y = &dummy;
  if (!comp)
    comp = &dummy;

  if (!stbi__pic_is4(s, "\x53\x80\xF6\x34")) {
    stbi__rewind(s);
    return 0;
  }

  stbi__skip(s, 88);

  *x = stbi__get16be(s);
  *y = stbi__get16be(s);
  if (stbi__at_eof(s)) {
    stbi__rewind(s);
    return 0;
  }
  if ((*x) != 0 && (1 << 28) / (*x) < (*y)) {
    stbi__rewind(s);
    return 0;
  }

  stbi__skip(s, 8);

  do {
    stbi__pic_packet *packet;

    if (num_packets == sizeof(packets) / sizeof(packets[0]))
      return 0;

    packet = &packets[num_packets++];
    chained = stbi__get8(s);
    packet->size = stbi__get8(s);
    packet->type = stbi__get8(s);
    packet->channel = stbi__get8(s);
    act_comp |= packet->channel;

    if (stbi__at_eof(s)) {
      stbi__rewind(s);
      return 0;
    }
    if (packet->size != 8) {
      stbi__rewind(s);
      return 0;
    }
  } while (chained);

  *comp = (act_comp & 0x10 ? 4 : 3);

  return 1;
}